

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::initCallbackProcessing(FederateState *this)

{
  int iVar1;
  GlobalFederateId GVar2;
  element_type *peVar3;
  long in_RDI;
  BrokerBase *this_00;
  ActionMessage bye;
  ActionMessage bye_1;
  ActionMessage exec;
  IterationRequest initIter;
  ActionMessage *in_stack_fffffffffffffd78;
  ActionMessage *message;
  BrokerBase *in_stack_fffffffffffffd80;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  ActionMessage local_198;
  BaseType local_d0;
  BaseType local_cc;
  ActionMessage local_c8;
  byte local_9;
  
  peVar3 = std::
           __shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x591d08);
  iVar1 = (*peVar3->_vptr_FederateOperator[2])();
  local_9 = (byte)iVar1;
  uVar4 = CONCAT13(local_9,(int3)in_stack_fffffffffffffda0);
  startingAction = (action_t)((ulong)in_RDI >> 0x20);
  if (2 < local_9) {
    if (local_9 == 3) {
      message = &local_198;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffda4,uVar4),startingAction);
      local_198.source_id =
           std::atomic<helics::GlobalFederateId>::load
                     ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
      local_198.dest_id = local_198.source_id;
      BrokerBase::addActionMessage(in_stack_fffffffffffffd80,message);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd80);
      goto LAB_00591f6e;
    }
    if (local_9 == 7) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffda4,uVar4),startingAction);
      GVar2 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(0xffffffe3,in_stack_fffffffffffffda8),
                 (char (*) [71])CONCAT44(GVar2.gid,uVar4));
      BrokerBase::addActionMessage(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd80);
      goto LAB_00591f6e;
    }
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffda4,uVar4),startingAction);
  this_00 = (BrokerBase *)(in_RDI + 0x2c);
  local_cc = (BaseType)
             std::atomic<helics::GlobalFederateId>::load
                       ((atomic<helics::GlobalFederateId> *)this_00,seq_cst);
  local_c8.source_id = (GlobalFederateId)local_cc;
  local_d0 = (BaseType)
             std::atomic<helics::GlobalFederateId>::load
                       ((atomic<helics::GlobalFederateId> *)this_00,seq_cst);
  local_c8.dest_id = (GlobalFederateId)local_d0;
  setIterationFlags((ActionMessage *)this_00,
                    (IterationRequest)((ulong)in_stack_fffffffffffffd78 >> 0x38));
  setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_c8,indicator_flag);
  BrokerBase::addActionMessage(this_00,in_stack_fffffffffffffd78);
  ActionMessage::~ActionMessage((ActionMessage *)this_00);
LAB_00591f6e:
  *(byte *)(in_RDI + 0x2fe) = local_9;
  return;
}

Assistant:

void FederateState::initCallbackProcessing()
{
    auto initIter = fedCallbacks->initializeOperations();
    switch (initIter) {
        case IterationRequest::NO_ITERATIONS:
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
        default: {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            exec.dest_id = global_id.load();
            setIterationFlags(exec, initIter);
            setActionFlag(exec, indicator_flag);
            mParent->addActionMessage(exec);
        } break;
        case IterationRequest::HALT_OPERATIONS: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            mParent->addActionMessage(bye);
        } break;
        case IterationRequest::ERROR_CONDITION:
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "Callback federate unspecified error condition in initializing callback";
            mParent->addActionMessage(bye);
            break;
    }
    lastIterationRequest = initIter;
}